

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLinearizeVisitor.cpp
# Opt level: O0

void __thiscall IRT::CLinearizeVisitor::CLinearizeVisitor(CLinearizeVisitor *this)

{
  CStatementList *this_00;
  unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_> local_18;
  CLinearizeVisitor *local_10;
  CLinearizeVisitor *this_local;
  
  local_10 = this;
  IVisitor::IVisitor(&this->super_IVisitor);
  (this->super_IVisitor)._vptr_IVisitor = (_func_int **)&PTR_Visit_00238a40;
  std::unique_ptr<IRT::CStatementList,std::default_delete<IRT::CStatementList>>::
  unique_ptr<std::default_delete<IRT::CStatementList>,void>
            ((unique_ptr<IRT::CStatementList,std::default_delete<IRT::CStatementList>> *)
             &this->statementList);
  this_00 = (CStatementList *)operator_new(0x20);
  CStatementList::CStatementList(this_00);
  std::unique_ptr<IRT::CStatementList,std::default_delete<IRT::CStatementList>>::
  unique_ptr<std::default_delete<IRT::CStatementList>,void>
            ((unique_ptr<IRT::CStatementList,std::default_delete<IRT::CStatementList>> *)&local_18,
             this_00);
  std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>::operator=
            (&this->statementList,&local_18);
  std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>::~unique_ptr
            (&local_18);
  return;
}

Assistant:

IRT::CLinearizeVisitor::CLinearizeVisitor( ) {
    statementList = std::unique_ptr<CStatementList>( new CStatementList( ));
}